

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

sexp_conflict
sexp_25_send_file_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg1,
          sexp_conflict arg2,sexp_conflict arg3)

{
  sexp_conflict psVar1;
  
  if (((ulong)arg0 & 3) == 0) {
    if (arg0->tag != 0x12) goto LAB_00103016;
  }
  else if (((ulong)arg0 & 1) == 0) {
LAB_00103016:
    psVar1 = (sexp_conflict)sexp_type_exception(ctx,self,0x12,arg0);
    return psVar1;
  }
  if (((ulong)arg1 & 3) == 0) {
    if (arg1->tag == 0x12) goto LAB_00103043;
  }
  else if (((ulong)arg1 & 1) != 0) {
LAB_00103043:
    if ((((ulong)arg2 & 1) == 0) && ((((ulong)arg2 & 2) != 0 || (arg2->tag != 0xc)))) {
      psVar1 = (sexp_conflict)sexp_type_exception(ctx,self,2,arg2);
      return psVar1;
    }
    if ((((ulong)arg3 & 1) == 0) && ((((ulong)arg3 & 2) != 0 || (arg3->tag != 0xc)))) {
      psVar1 = (sexp_conflict)sexp_type_exception(ctx,self,2);
      return psVar1;
    }
    return (sexp_conflict)&DAT_0000003e;
  }
  psVar1 = (sexp_conflict)sexp_type_exception(ctx,self,0x12,arg1);
  return psVar1;
}

Assistant:

sexp sexp_25_send_file_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1, sexp arg2, sexp arg3) {
  int err = 0;
  off_t tmp4;
  sexp res;
  sexp_gc_var1(res4);
  if (! (sexp_filenop(arg0) || sexp_fixnump(arg0)))
    return sexp_type_exception(ctx, self, SEXP_FILENO, arg0);
  if (! (sexp_filenop(arg1) || sexp_fixnump(arg1)))
    return sexp_type_exception(ctx, self, SEXP_FILENO, arg1);
  if (! sexp_exact_integerp(arg2))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg2);
  if (! sexp_exact_integerp(arg3))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg3);
  sexp_gc_preserve1(ctx, res4);
  err = sexp_send_file((sexp_filenop(arg0) ? sexp_fileno_fd(arg0) : sexp_unbox_fixnum(arg0)), (sexp_filenop(arg1) ? sexp_fileno_fd(arg1) : sexp_unbox_fixnum(arg1)), sexp_sint_value(arg2), sexp_sint_value(arg3), &tmp4);
  if (err) {
  res = SEXP_FALSE;
  } else {
  res4 = sexp_make_integer(ctx, tmp4);
  res = res4;
  }
  sexp_gc_release1(ctx);
  return res;
}